

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O2

void debugDualChuzcFailNorms
               (HighsInt workCount,
               vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *workData,
               double *workDataNorm,HighsInt numVar,double *workDual,double *workDualNorm)

{
  pointer ppVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  *workDataNorm = 0.0;
  ppVar1 = (workData->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = 0;
  uVar4 = (ulong)(uint)workCount;
  if (workCount < 1) {
    uVar4 = 0;
  }
  dVar5 = 0.0;
  for (; uVar4 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
    dVar6 = *(double *)((long)&ppVar1->second + lVar3);
    dVar5 = dVar5 + dVar6 * dVar6;
    *workDataNorm = dVar5;
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar6 = 0.0;
  *workDataNorm = dVar5;
  *workDualNorm = 0.0;
  uVar2 = 0;
  uVar4 = (ulong)(uint)numVar;
  if (numVar < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    dVar6 = dVar6 + workDual[uVar2] * workDual[uVar2];
    *workDualNorm = dVar6;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  *workDualNorm = dVar6;
  return;
}

Assistant:

void debugDualChuzcFailNorms(
    const HighsInt workCount,
    const std::vector<std::pair<HighsInt, double>>& workData,
    double& workDataNorm, const HighsInt numVar, const double* workDual,
    double& workDualNorm) {
  workDataNorm = 0;
  for (HighsInt i = 0; i < workCount; i++) {
    double value = workData[i].second;
    workDataNorm += value * value;
  }
  workDataNorm = sqrt(workDataNorm);
  workDualNorm = 0;
  for (HighsInt iVar = 0; iVar < numVar; iVar++) {
    double value = workDual[iVar];
    workDualNorm += value * value;
  }
  workDualNorm = sqrt(workDualNorm);
}